

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O0

UTF_RET UTF_uj16_to_uj8(UTF_UC16 *uj16,size_t uj16size,UTF_UC8 *uj8,size_t uj8size)

{
  bool bVar1;
  UTF_UC8 *pUVar2;
  UTF_UC8 *pUVar3;
  UTF_UC8 *pUVar4;
  UTF_UC8 *uj8end;
  UTF_UC16 *uj16end;
  UTF_UC8 uc8 [4];
  UTF_UC16 uc16 [2];
  size_t uj8size_local;
  UTF_UC8 *uj8_local;
  size_t uj16size_local;
  UTF_UC16 *uj16_local;
  
  pUVar2 = uj8 + (uj8size - 1);
  _uc8 = uj8size;
  uj8size_local = (size_t)uj8;
  uj16size_local = (size_t)uj16;
  if ((uj8size == 0) && (uj16size != 0)) {
    uj16_local._4_4_ = UTF_INSUFFICIENT_BUFFER;
  }
  else {
    for (; (UTF_UC16 *)uj16size_local != uj16 + uj16size; uj16size_local = uj16size_local + 2) {
      bVar1 = UTF_uc16_is_surrogate_high(*(UTF_UC16 *)uj16size_local);
      if (bVar1) {
        uj16end._4_2_ = *(undefined2 *)uj16size_local;
        uj16size_local = uj16size_local + 2;
        if ((UTF_UC16 *)uj16size_local == uj16 + uj16size) {
          if ((UTF_UC8 *)uj8size_local == pUVar2) {
            *(undefined1 *)uj8size_local = 0;
            return UTF_INSUFFICIENT_BUFFER;
          }
          *(undefined1 *)uj8size_local = 0x3f;
          *(undefined1 *)(uj8size_local + 1) = 0;
          return UTF_SUCCESS;
        }
        uj16end._6_2_ = *(UTF_UC16 *)uj16size_local;
      }
      else {
        uj16end._4_2_ = *(undefined2 *)uj16size_local;
        uj16end._6_2_ = L'\0';
      }
      bVar1 = UTF_uc16_to_uc8((UTF_UC16 *)((long)&uj16end + 4),(UTF_UC8 *)&uj16end);
      if (!bVar1) {
        uj16end._4_2_ = 0x3f;
        uj16end._6_2_ = L'\0';
      }
      if ((UTF_UC8 *)uj8size_local == pUVar2) {
        *(undefined1 *)uj8size_local = 0;
        return UTF_INSUFFICIENT_BUFFER;
      }
      pUVar3 = (UTF_UC8 *)(uj8size_local + 1);
      *(undefined1 *)uj8size_local = uj16end._0_1_;
      if (uj16end._1_1_ != '\0') {
        if (pUVar3 == pUVar2) {
          *pUVar3 = '\0';
          return UTF_INSUFFICIENT_BUFFER;
        }
        pUVar4 = (UTF_UC8 *)(uj8size_local + 2);
        *pUVar3 = uj16end._1_1_;
        pUVar3 = pUVar4;
        if (uj16end._2_1_ != '\0') {
          if (pUVar4 == pUVar2) {
            *pUVar4 = '\0';
            return UTF_INSUFFICIENT_BUFFER;
          }
          pUVar3 = (UTF_UC8 *)(uj8size_local + 3);
          *pUVar4 = uj16end._2_1_;
          if (uj16end._3_1_ != '\0') {
            if (pUVar3 == pUVar2) {
              *pUVar3 = '\0';
              return UTF_INSUFFICIENT_BUFFER;
            }
            *pUVar3 = uj16end._3_1_;
            pUVar3 = (UTF_UC8 *)(uj8size_local + 4);
          }
        }
      }
      uj8size_local = (size_t)pUVar3;
    }
    *(undefined1 *)uj8size_local = 0;
    uj16_local._4_4_ = UTF_SUCCESS;
  }
  return uj16_local._4_4_;
}

Assistant:

static __inline UTF_RET
UTF_uj16_to_uj8(const UTF_UC16 *uj16, UTF_SIZE_T uj16size, UTF_UC8 *uj8, UTF_SIZE_T uj8size)
{
    UTF_UC16 uc16[2];
    UTF_UC8 uc8[4];
    const UTF_UC16 *uj16end = uj16 + uj16size;
    UTF_UC8 *uj8end = uj8 + uj8size - 1;

    if (!uj8size && uj16size)
        return UTF_INSUFFICIENT_BUFFER;

    for (; uj16 != uj16end; ++uj16)
    {
        if (UTF_uc16_is_surrogate_high(*uj16))
        {
            uc16[0] = *uj16;
            if (++uj16 == uj16end)
            {
                if (!UTF_DEFAULT_CHAR)
                {
                    *uj8 = 0;
                    return UTF_INVALID;
                }
                if (uj8 == uj8end)
                {
                    *uj8 = 0;
                    return UTF_INSUFFICIENT_BUFFER;
                }
                *uj8++ = UTF_STATIC_CAST(UTF_UC8, UTF_DEFAULT_CHAR);
                *uj8 = 0;
                return UTF_SUCCESS;
            }
            uc16[1] = *uj16;
        }
        else
        {
            uc16[0] = *uj16;
            uc16[1] = 0;
        }

        if (!UTF_uc16_to_uc8(uc16, uc8))
        {
            if (!UTF_DEFAULT_CHAR)
            {
                *uj8 = 0;
                return UTF_INVALID;
            }
            uc16[0] = UTF_DEFAULT_CHAR;
            uc16[1] = 0;
        }

        if (uj8 == uj8end)
        {
            *uj8 = 0;
            return UTF_INSUFFICIENT_BUFFER;
        }

        *uj8++ = uc8[0];
        if (uc8[1])
        {
            if (uj8 == uj8end)
            {
                *uj8 = 0;
                return UTF_INSUFFICIENT_BUFFER;
            }
            *uj8++ = uc8[1];
            if (uc8[2])
            {
                if (uj8 == uj8end)
                {
                    *uj8 = 0;
                    return UTF_INSUFFICIENT_BUFFER;
                }
                *uj8++ = uc8[2];
                if (uc8[3])
                {
                    if (uj8 == uj8end)
                    {
                        *uj8 = 0;
                        return UTF_INSUFFICIENT_BUFFER;
                    }
                    *uj8++ = uc8[3];
                }
            }
        }
    }
    *uj8 = 0;
    return UTF_SUCCESS;
}